

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O0

void secp256k1_pedersen_scalar_set_u64(secp256k1_scalar *sec,uint64_t value)

{
  int local_3c;
  uchar local_38 [4];
  int i;
  uchar data [32];
  uint64_t value_local;
  secp256k1_scalar *sec_local;
  
  for (local_3c = 0; data._24_8_ = value, local_3c < 0x18; local_3c = local_3c + 1) {
    local_38[local_3c] = '\0';
  }
  for (; local_3c < 0x20; local_3c = local_3c + 1) {
    local_38[local_3c] = SUB81(data._24_8_,7);
    data._24_8_ = data._24_8_ << 8;
  }
  secp256k1_scalar_set_b32(sec,local_38,(int *)0x0);
  memset(local_38,0,0x20);
  return;
}

Assistant:

static void secp256k1_pedersen_scalar_set_u64(secp256k1_scalar *sec, uint64_t value) {
    unsigned char data[32];
    int i;
    for (i = 0; i < 24; i++) {
        data[i] = 0;
    }
    for (; i < 32; i++) {
        data[i] = value >> 56;
        value <<= 8;
    }
    secp256k1_scalar_set_b32(sec, data, NULL);
    memset(data, 0, 32);
}